

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::deduplicateUnary(OptimizeInstructions *this,Unary *unaryOuter)

{
  Id IVar1;
  Index IVar2;
  Expression *pEVar3;
  
  pEVar3 = unaryOuter->value;
  if ((pEVar3->_id == UnaryId) && (IVar1 = pEVar3[1]._id, IVar1 == unaryOuter->op)) {
    if ((int)IVar1 < 0x14) {
      if (IVar1 - LocalGetId < 10) {
        return pEVar3;
      }
      if (1 < IVar1 - CallId) {
        return (Expression *)0x0;
      }
    }
    else {
      if (IVar1 - TableSizeId < 2) {
        if (((((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
              .currModule)->features).features & 0x20) != 0) {
          return pEVar3;
        }
        __assert_fail("getModule()->features.hasSignExt()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                      ,0x114e,"Expression *wasm::OptimizeInstructions::deduplicateUnary(Unary *)");
      }
      if (IVar1 != MemorySizeId) {
        return (Expression *)0x0;
      }
      IVar2 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)pEVar3[1].type.id,this);
      if (IVar2 != 1) goto LAB_007f59da;
    }
    pEVar3 = (Expression *)pEVar3[1].type.id;
  }
  else {
LAB_007f59da:
    pEVar3 = (Expression *)0x0;
  }
  return pEVar3;
}

Assistant:

Expression* deduplicateUnary(Unary* unaryOuter) {
    if (auto* unaryInner = unaryOuter->value->dynCast<Unary>()) {
      if (unaryInner->op == unaryOuter->op) {
        switch (unaryInner->op) {
          case NegFloat32:
          case NegFloat64: {
            // neg(neg(x))  ==>   x
            return unaryInner->value;
          }
          case AbsFloat32:
          case CeilFloat32:
          case FloorFloat32:
          case TruncFloat32:
          case NearestFloat32:
          case AbsFloat64:
          case CeilFloat64:
          case FloorFloat64:
          case TruncFloat64:
          case NearestFloat64: {
            // unaryOp(unaryOp(x))  ==>   unaryOp(x)
            return unaryInner;
          }
          case ExtendS8Int32:
          case ExtendS16Int32: {
            assert(getModule()->features.hasSignExt());
            return unaryInner;
          }
          case EqZInt32: {
            // eqz(eqz(bool(x)))  ==>   bool(x)
            if (Bits::getMaxBits(unaryInner->value, this) == 1) {
              return unaryInner->value;
            }
            break;
          }
          default: {
          }
        }
      }
    }
    return nullptr;
  }